

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular-array.h
# Opt level: O2

void __thiscall
wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::~CircularArray
          (CircularArray<(anonymous_namespace)::TestObject,_2UL> *this)

{
  long lVar1;
  int iVar2;
  
  clear(this);
  lVar1 = 0x18;
  iVar2 = ::(anonymous_namespace)::TestObject::destruct_count;
  do {
    if (*(char *)((long)(this->contents_)._M_elems + lVar1 + -4) == '\0') {
      iVar2 = iVar2 + 1;
      ::(anonymous_namespace)::TestObject::destruct_count = iVar2;
    }
    lVar1 = lVar1 + -0xc;
  } while (lVar1 != 0);
  return;
}

Assistant:

~CircularArray() { clear(); }